

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_FonSigned(Cba_Ntk_t *p,int f)

{
  int iVar1;
  char *pcVar2;
  
  if (-1 < f) {
    iVar1 = Cba_FonRangeId(p,f);
    iVar1 = Abc_LitIsCompl(iVar1);
    return iVar1;
  }
  iVar1 = Cba_FonConst(f);
  pcVar2 = Cba_NtkConst(p,iVar1);
  pcVar2 = strchr(pcVar2,0x73);
  return (int)(pcVar2 != (char *)0x0);
}

Assistant:

static inline int            Cba_FonSigned( Cba_Ntk_t * p, int f )           { return Cba_FonIsConst(f) ? Cba_FonConstSigned(p, f) : Abc_LitIsCompl(Cba_FonRangeId(p, f)); }